

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O3

void __thiscall ED::ComputeGradient(ED *this)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  short *psVar14;
  int iVar15;
  ulong in_R10;
  int in_R11D;
  int iVar16;
  int iVar17;
  
  iVar4 = this->width;
  uVar3 = (ulong)iVar4;
  if ((long)uVar3 < 1) {
    iVar15 = this->height;
    uVar12 = iVar15 - 1;
  }
  else {
    sVar6 = (short)this->gradThresh + -1;
    psVar14 = this->gradImg;
    iVar15 = this->height;
    uVar12 = iVar15 - 1;
    in_R10 = 0;
    do {
      psVar14[(long)(int)(uVar12 * iVar4) + in_R10] = sVar6;
      psVar14[in_R10] = sVar6;
      in_R10 = in_R10 + 1;
    } while (uVar3 != in_R10);
  }
  if (2 < iVar15) {
    sVar6 = (short)this->gradThresh + -1;
    psVar14 = this->gradImg;
    lVar5 = (ulong)uVar12 - 1;
    do {
      psVar14[uVar3 * 2 + -1] = sVar6;
      psVar14[uVar3] = sVar6;
      psVar14 = psVar14 + uVar3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (2 < iVar15) {
      iVar4 = 1;
      iVar7 = 2;
      iVar13 = 0;
      do {
        if (2 < (int)uVar3) {
          lVar5 = 1;
          do {
            iVar15 = (int)uVar3;
            iVar2 = (int)lVar5;
            if (3 < this->op - PREWITT_OPERATOR) goto LAB_00105db9;
            puVar1 = this->smoothImg;
            iVar16 = iVar7 * iVar15;
            iVar8 = iVar13 * iVar15;
            iVar9 = (uint)puVar1[lVar5 + 1 + (long)iVar16] - (uint)puVar1[lVar5 + -1 + (long)iVar8];
            iVar17 = (uint)puVar1[lVar5 + 1 + (long)iVar8] - (uint)puVar1[lVar5 + -1 + (long)iVar16]
            ;
            switch(this->op) {
            case PREWITT_OPERATOR:
              lVar10 = (long)(iVar4 * iVar15 + iVar2);
              uVar11 = ((uint)puVar1[lVar10 + 1] + iVar17 + iVar9) - (uint)puVar1[lVar10 + -1];
              uVar12 = -uVar11;
              if (0 < (int)uVar11) {
                uVar12 = uVar11;
              }
              in_R10 = (ulong)uVar12;
              iVar9 = ((uint)puVar1[lVar5 + iVar16] + iVar9) -
                      ((uint)puVar1[lVar5 + iVar8] + iVar17);
              in_R11D = -iVar9;
              if (0 < iVar9) {
                in_R11D = iVar9;
              }
              break;
            case SOBEL_OPERATOR:
              lVar10 = (long)(iVar4 * iVar15 + iVar2);
              uVar12 = iVar17 + iVar9 + ((uint)puVar1[lVar10 + 1] - (uint)puVar1[lVar10 + -1]) * 2;
              uVar11 = -uVar12;
              if (0 < (int)uVar12) {
                uVar11 = uVar12;
              }
              iVar9 = iVar9 - iVar17;
              iVar8 = (uint)puVar1[lVar5 + iVar16] - (uint)puVar1[lVar5 + iVar8];
              goto LAB_00105dab;
            case SCHARR_OPERATOR:
              lVar10 = (long)(iVar4 * iVar15 + iVar2);
              uVar12 = (iVar17 + iVar9) * 3 +
                       ((uint)puVar1[lVar10 + 1] - (uint)puVar1[lVar10 + -1]) * 10;
              uVar11 = -uVar12;
              if (0 < (int)uVar12) {
                uVar11 = uVar12;
              }
              iVar9 = (iVar9 - iVar17) * 3;
              iVar8 = ((uint)puVar1[lVar5 + iVar16] - (uint)puVar1[lVar5 + iVar8]) * 5;
LAB_00105dab:
              in_R10 = (ulong)uVar11;
              iVar9 = iVar9 + iVar8 * 2;
              in_R11D = -iVar9;
              if (0 < iVar9) {
                in_R11D = iVar9;
              }
              break;
            case LSD_OPERATOR:
              lVar10 = (long)(iVar4 * iVar15 + iVar2);
              iVar9 = (uint)puVar1[lVar5 + 1 + (long)iVar16] - (uint)puVar1[lVar10];
              uVar12 = ((uint)puVar1[lVar10 + 1] - (uint)puVar1[lVar5 + iVar16]) + iVar9;
              uVar11 = -uVar12;
              if (0 < (int)uVar12) {
                uVar11 = uVar12;
              }
              in_R10 = (ulong)uVar11;
              iVar9 = iVar9 - ((uint)puVar1[lVar10 + 1] - (uint)puVar1[lVar5 + iVar16]);
              in_R11D = -iVar9;
              if (0 < iVar9) {
                in_R11D = iVar9;
              }
            }
LAB_00105db9:
            iVar9 = (int)in_R10;
            if (this->sumFlag == true) {
              iVar8 = in_R11D + iVar9;
            }
            else {
              iVar8 = (int)SQRT((double)iVar9 * (double)iVar9 + (double)(in_R11D * in_R11D));
            }
            iVar2 = iVar15 * iVar4 + iVar2;
            this->gradImg[iVar2] = (short)iVar8;
            if (this->gradThresh <= iVar8) {
              this->dirImg[iVar2] = (iVar9 < in_R11D) + '\x01';
            }
            uVar3 = (ulong)(uint)this->width;
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 < (int)(this->width - 1U));
          iVar15 = this->height;
        }
        iVar4 = iVar4 + 1;
        iVar7 = iVar7 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar4 < iVar15 + -1);
    }
  }
  return;
}

Assistant:

void ED::ComputeGradient()
{	
	// Initialize gradient image for row = 0, row = height-1, column=0, column=width-1 
	for (int j = 0; j<width; j++) { gradImg[j] = gradImg[(height - 1)*width + j] = gradThresh - 1; }
	for (int i = 1; i<height - 1; i++) { gradImg[i*width] = gradImg[(i + 1)*width - 1] = gradThresh - 1; }

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// 
			// For Prewitt
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			// For Sobel
			// Then: gx = com1 + com2 + 2*(E-D) = (H-A) + (C-F) + 2*(E-D) = (C-A) + 2*(E-D) + (H-F)
			//       gy = com1 - com2 + 2*(G-B) = (H-A) - (C-F) + 2*(G-B) = (F-A) + 2*(G-B) + (H-C)
			//
			// For Scharr
			// Then: gx = 3*(com1 + com2) + 10*(E-D) = 3*(H-A) + 3*(C-F) + 10*(E-D) = 3*(C-A) + 10*(E-D) + 3*(H-F)
			//       gy = 3*(com1 - com2) + 10*(G-B) = 3*(H-A) - 3*(C-F) + 10*(G-B) = 3*(F-A) + 10*(G-B) + 3*(H-C)
			//
			// For LSD
			// A B
			// C D
			// gx = (B-A) + (D-C)
			// gy = (C-A) + (D-B)
			//
			// To make this faster: 
			// com1 = (D-A)
			// com2 = (B-C)
			// Then: gx = com1 + com2 = (D-A) + (B-C) = (B-A) + (D-C)
			//       gy = com1 - com2 = (D-A) - (B-C) = (C-A) + (D-B)

			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx;
			int gy;
			
			switch (op)
			{
			case PREWITT_OPERATOR:
				gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SOBEL_OPERATOR:
				gx = abs(com1 + com2 + 2 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + 2 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SCHARR_OPERATOR:
				gx = abs(3 * (com1 + com2) + 10 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(3 * (com1 - com2) + 10 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case LSD_OPERATOR:
				// com1 and com2 differs from previous operators, because LSD has 2x2 kernel
				int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[i*width + j];
				int com2 = smoothImg[i*width + j + 1] - smoothImg[(i + 1)*width + j];

				gx = abs(com1 + com2);
				gy = abs(com1 - com2);
			}
			
			int sum;

			if(sumFlag)
				sum = gx + gy;
			else
				sum = (int)sqrt((double)gx*gx + gy*gy);

			int index = i*width + j;
			gradImg[index] = sum;

			if (sum >= gradThresh) {
				if (gx >= gy) dirImg[index] = EDGE_VERTICAL;
				else          dirImg[index] = EDGE_HORIZONTAL;
			} //end-if
		} // end-for
	} // end-for
}